

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

bool __thiscall
brotli::HashLongestMatchQuickly<16,_1,_true>::FindLongestMatch
          (HashLongestMatchQuickly<16,_1,_true> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *s2;
  double dVar1;
  uint8_t uVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  ulong limit;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int local_50;
  
  sVar9 = *best_len_out;
  s2 = ring_buffer + (cur_ix & ring_buffer_mask);
  lVar5 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  uVar12 = (ulong)(lVar5 * 0x1e35a7bd000000) >> 0x30;
  dVar1 = *best_score_out;
  iVar4 = *distance_cache;
  uVar10 = cur_ix - (long)iVar4;
  uVar2 = s2[sVar9];
  uVar11 = (uint32_t)cur_ix;
  if (((uVar10 < cur_ix) &&
      (uVar2 == (ring_buffer + ((uint)uVar10 & (uint)ring_buffer_mask))[sVar9])) &&
     (sVar8 = FindMatchLengthWithLimit
                        (ring_buffer + ((uint)uVar10 & (uint)ring_buffer_mask),s2,max_length),
     3 < sVar8)) {
    auVar15._8_4_ = (int)(sVar8 >> 0x20);
    auVar15._0_8_ = sVar8;
    auVar15._12_4_ = 0x45300000;
    *best_len_out = sVar8;
    *best_len_code_out = sVar8;
    *best_distance_out = (long)iVar4;
    *best_score_out =
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)) * 5.4 + 0.6;
    this->buckets_[uVar12] = uVar11;
    return true;
  }
  uVar7 = this->buckets_[uVar12];
  this->buckets_[uVar12] = uVar11;
  if (uVar2 != (ring_buffer + ((uint)ring_buffer_mask & uVar7))[sVar9]) {
    return false;
  }
  if (cur_ix == uVar7) {
    return false;
  }
  uVar10 = cur_ix - uVar7;
  if (max_backward < uVar10) {
    return false;
  }
  sVar9 = FindMatchLengthWithLimit(ring_buffer + ((uint)ring_buffer_mask & uVar7),s2,max_length);
  if (3 < sVar9) {
    *best_len_out = sVar9;
    *best_len_code_out = sVar9;
    auVar14._8_4_ = (int)(sVar9 >> 0x20);
    auVar14._0_8_ = sVar9;
    auVar14._12_4_ = 0x45300000;
    iVar4 = 0x1f;
    if ((uint)uVar10 != 0) {
      for (; (uint)uVar10 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    *best_distance_out = uVar10;
    *best_score_out =
         ((auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) * 5.4 +
         (double)iVar4 * -1.2;
    return true;
  }
  uVar10 = this->num_dict_matches_;
  if (uVar10 < this->num_dict_lookups_ >> 7) {
    bVar6 = false;
    goto LAB_0016a65d;
  }
  this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
  local_50 = (int)lVar5;
  uVar3 = *(ushort *)(kStaticDictionaryHash + (ulong)((uint)(local_50 * 0x1e35a7bd) >> 0x12) * 4);
  if (uVar3 != 0) {
    limit = (ulong)(uVar3 & 0x1f);
    if (limit <= max_length) {
      sVar9 = FindMatchLengthWithLimit
                        (s2,kBrotliDictionary +
                            ((uVar3 & 0x1f) * (uint)(uVar3 >> 5) +
                            kBrotliDictionaryOffsetsByLength[limit]),limit);
      bVar6 = false;
      if ((sVar9 == 0) || (bVar6 = false, sVar9 + 10 <= limit)) goto LAB_0016a65d;
      sVar8 = (long)(1 << (""[limit] & 0x1f)) * (ulong)(byte)kCutoffTransforms[limit - sVar9] +
              max_backward + (uVar3 >> 5) + 1;
      auVar16._8_4_ = (int)(sVar9 >> 0x20);
      auVar16._0_8_ = sVar9;
      auVar16._12_4_ = 0x45300000;
      iVar4 = 0x1f;
      uVar7 = (uint)sVar8;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      dVar13 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) * 5.4 +
               (double)iVar4 * -1.2;
      if (dVar1 < dVar13) {
        this->num_dict_matches_ = uVar10 + 1;
        *best_len_out = sVar9;
        *best_len_code_out = limit;
        *best_distance_out = sVar8;
        *best_score_out = dVar13;
        bVar6 = true;
        goto LAB_0016a65d;
      }
    }
  }
  bVar6 = false;
LAB_0016a65d:
  this->buckets_[uVar12] = uVar11;
  return bVar6;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }